

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Redux.h
# Opt level: O2

Scalar Eigen::internal::
       redux_impl<Eigen::internal::scalar_max_op<double,double,0>,Eigen::internal::redux_evaluator<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>>,3,0>
       ::run<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
                 (redux_evaluator<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                  *eval,scalar_max_op<double,_double,_0> *func,
                 Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *xpr)

{
  long lVar1;
  PointerType pdVar2;
  double dVar3;
  long lVar4;
  Index index;
  Index IVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  double dVar9;
  Scalar elements [2];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  lVar1 = (xpr->super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>)
          .super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>.
          m_rows.m_value;
  IVar5 = first_aligned_impl<16,_Eigen::Block<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_1,_false>,_false>
          ::run(xpr);
  lVar7 = lVar1 - IVar5;
  pdVar2 = (eval->
           super_evaluator<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>).
           super_block_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
           .m_data;
  if (lVar7 + 1U < 3) {
    dVar9 = *pdVar2;
    for (lVar7 = 1; lVar7 < lVar1; lVar7 = lVar7 + 1) {
      dVar3 = pdVar2[lVar7];
      if (pdVar2[lVar7] <= dVar9) {
        dVar3 = dVar9;
      }
      dVar9 = dVar3;
    }
  }
  else {
    auVar10 = *(undefined1 (*) [16])(pdVar2 + IVar5);
    if (3 < lVar7) {
      lVar6 = IVar5 + (lVar7 / 4) * 4;
      auVar11 = *(undefined1 (*) [16])(pdVar2 + IVar5 + 2);
      lVar4 = IVar5;
      while (lVar8 = lVar4 + 4, lVar8 < lVar6) {
        auVar10 = maxpd(*(undefined1 (*) [16])(pdVar2 + lVar8),auVar10);
        auVar11 = maxpd(*(undefined1 (*) [16])(pdVar2 + lVar4 + 6),auVar11);
        lVar4 = lVar8;
      }
      auVar10 = maxpd(auVar11,auVar10);
      if ((lVar7 / 4) * 4 < (lVar7 / 2) * 2) {
        auVar10 = maxpd(*(undefined1 (*) [16])(pdVar2 + lVar6),auVar10);
      }
    }
    lVar7 = IVar5 + (lVar7 / 2) * 2;
    dVar9 = auVar10._8_8_;
    if (auVar10._8_8_ <= auVar10._0_8_) {
      dVar9 = auVar10._0_8_;
    }
    lVar6 = 0;
    if (IVar5 < 1) {
      IVar5 = lVar6;
    }
    for (; IVar5 != lVar6; lVar6 = lVar6 + 1) {
      dVar3 = pdVar2[lVar6];
      if (pdVar2[lVar6] <= dVar9) {
        dVar3 = dVar9;
      }
      dVar9 = dVar3;
    }
    for (; lVar7 < lVar1; lVar7 = lVar7 + 1) {
      dVar3 = pdVar2[lVar7];
      if (pdVar2[lVar7] <= dVar9) {
        dVar3 = dVar9;
      }
      dVar9 = dVar3;
    }
  }
  return dVar9;
}

Assistant:

static Scalar run(const Evaluator &eval, const Func& func, const XprType& xpr)
  {
    const Index size = xpr.size();
    
    const Index packetSize = redux_traits<Func, Evaluator>::PacketSize;
    const int packetAlignment = unpacket_traits<PacketScalar>::alignment;
    enum {
      alignment0 = (bool(Evaluator::Flags & DirectAccessBit) && bool(packet_traits<Scalar>::AlignedOnScalar)) ? int(packetAlignment) : int(Unaligned),
      alignment = EIGEN_PLAIN_ENUM_MAX(alignment0, Evaluator::Alignment)
    };
    const Index alignedStart = internal::first_default_aligned(xpr);
    const Index alignedSize2 = ((size-alignedStart)/(2*packetSize))*(2*packetSize);
    const Index alignedSize = ((size-alignedStart)/(packetSize))*(packetSize);
    const Index alignedEnd2 = alignedStart + alignedSize2;
    const Index alignedEnd  = alignedStart + alignedSize;
    Scalar res;
    if(alignedSize)
    {
      PacketScalar packet_res0 = eval.template packet<alignment,PacketScalar>(alignedStart);
      if(alignedSize>packetSize) // we have at least two packets to partly unroll the loop
      {
        PacketScalar packet_res1 = eval.template packet<alignment,PacketScalar>(alignedStart+packetSize);
        for(Index index = alignedStart + 2*packetSize; index < alignedEnd2; index += 2*packetSize)
        {
          packet_res0 = func.packetOp(packet_res0, eval.template packet<alignment,PacketScalar>(index));
          packet_res1 = func.packetOp(packet_res1, eval.template packet<alignment,PacketScalar>(index+packetSize));
        }

        packet_res0 = func.packetOp(packet_res0,packet_res1);
        if(alignedEnd>alignedEnd2)
          packet_res0 = func.packetOp(packet_res0, eval.template packet<alignment,PacketScalar>(alignedEnd2));
      }
      res = func.predux(packet_res0);

      for(Index index = 0; index < alignedStart; ++index)
        res = func(res,eval.coeff(index));

      for(Index index = alignedEnd; index < size; ++index)
        res = func(res,eval.coeff(index));
    }
    else // too small to vectorize anything.
         // since this is dynamic-size hence inefficient anyway for such small sizes, don't try to optimize.
    {
      res = eval.coeff(0);
      for(Index index = 1; index < size; ++index)
        res = func(res,eval.coeff(index));
    }

    return res;
  }